

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

int __thiscall Bitvec08x16::Popcount(Bitvec08x16 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i counts;
  Bitvec08x16 *this_local;
  
  auVar2 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])this->vec);
  auVar1 = vpunpckhqdq_avx(auVar2,auVar2);
  return auVar2._0_4_ + auVar1._0_4_;
}

Assistant:

inline int Popcount() const {
#if(defined __AVX512VPOPCNTDQ__ && defined __AVX512VL__)
        __m128i counts = _mm_popcnt_epi64(vec);
        return _mm_cvtsi128_si64(counts) + _mm_cvtsi128_si64(_mm_unpackhi_epi64(counts, counts));
#else
        // unpackhi_epi64+cvtsi128_si64 compiles to the same instructions as extract_epi64,
        // but works on windows where extract_epi64 is missing.
        return NumBitsSet64((uint64_t) _mm_cvtsi128_si64(vec)) +
               NumBitsSet64((uint64_t) _mm_cvtsi128_si64(_mm_unpackhi_epi64(vec, vec)));
#endif
    }